

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int resolve_pseudo_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name)

{
  int iVar1;
  
  iVar1 = -1;
  if (s->has_this_binding != 0) {
    if ((int)var_name < 0x72) {
      if (var_name == 8) {
        if (s->this_var_idx < 0) {
          iVar1 = add_var_this(ctx,s);
          s->this_var_idx = iVar1;
        }
        iVar1 = s->this_var_idx;
      }
      else if (var_name == 0x71) {
        if (s->new_target_var_idx < 0) {
          iVar1 = add_var(ctx,s,0x71);
          s->new_target_var_idx = iVar1;
        }
        iVar1 = s->new_target_var_idx;
      }
    }
    else if (var_name == 0x72) {
      if (s->this_active_func_var_idx < 0) {
        iVar1 = add_var(ctx,s,0x72);
        s->this_active_func_var_idx = iVar1;
      }
      iVar1 = s->this_active_func_var_idx;
    }
    else if (var_name == 0x73) {
      if (s->home_object_var_idx < 0) {
        iVar1 = add_var(ctx,s,0x73);
        s->home_object_var_idx = iVar1;
      }
      iVar1 = s->home_object_var_idx;
    }
  }
  return iVar1;
}

Assistant:

static int resolve_pseudo_var(JSContext *ctx, JSFunctionDef *s,
                               JSAtom var_name)
{
    int var_idx;

    if (!s->has_this_binding)
        return -1;
    switch(var_name) {
    case JS_ATOM_home_object:
        /* 'home_object' pseudo variable */
        if (s->home_object_var_idx < 0)
            s->home_object_var_idx = add_var(ctx, s, var_name);
        var_idx = s->home_object_var_idx;
        break;
    case JS_ATOM_this_active_func:
        /* 'this.active_func' pseudo variable */
        if (s->this_active_func_var_idx < 0)
            s->this_active_func_var_idx = add_var(ctx, s, var_name);
        var_idx = s->this_active_func_var_idx;
        break;
    case JS_ATOM_new_target:
        /* 'new.target' pseudo variable */
        if (s->new_target_var_idx < 0)
            s->new_target_var_idx = add_var(ctx, s, var_name);
        var_idx = s->new_target_var_idx;
        break;
    case JS_ATOM_this:
        /* 'this' pseudo variable */
        if (s->this_var_idx < 0)
            s->this_var_idx = add_var_this(ctx, s);
        var_idx = s->this_var_idx;
        break;
    default:
        var_idx = -1;
        break;
    }
    return var_idx;
}